

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::EnumSchema::Enumerant>::~ArrayBuilder
          (ArrayBuilder<capnp::EnumSchema::Enumerant> *this)

{
  Enumerant *pEVar1;
  RemoveConst<capnp::EnumSchema::Enumerant> *pRVar2;
  Enumerant *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Enumerant *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Enumerant *)0x0;
    this->pos = (RemoveConst<capnp::EnumSchema::Enumerant> *)0x0;
    this->endPtr = (Enumerant *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pEVar1,0x40,(long)pRVar2 - (long)pEVar1 >> 6,
               (long)pEVar3 - (long)pEVar1 >> 6,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }